

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

matrix4 * matrix4_inverse(matrix4 *self,matrix4 *mR)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  undefined1 auVar39 [16];
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  undefined1 auVar48 [16];
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  undefined1 auVar56 [16];
  long lVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  undefined4 uVar71;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  double dStack_350;
  double dStack_340;
  double dStack_320;
  double dStack_310;
  double dStack_300;
  double dStack_2d0;
  undefined8 uStack_2b0;
  double dStack_2a0;
  double dStack_290;
  double dStack_270;
  double dStack_260;
  double dStack_250;
  double dStack_210;
  double dStack_200;
  double dStack_1e0;
  double dStack_1d0;
  double dStack_1c0;
  double dStack_1a0;
  double dStack_190;
  double dStack_170;
  double dStack_160;
  double dStack_150;
  double dStack_140;
  double dStack_130;
  double dStack_120;
  double dStack_100;
  double dStack_f0;
  double dStack_e0;
  double dStack_d0;
  double dStack_b0;
  undefined1 local_98 [8];
  double adStack_90 [9];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  dVar24 = matrix4_determinant(self);
  uVar58 = (undefined4)((ulong)-dVar24 >> 0x20);
  if (-dVar24 <= dVar24) {
    uVar58 = (undefined4)((ulong)dVar24 >> 0x20);
  }
  if ((double)CONCAT44(uVar58,SUB84(dVar24,0)) <= 1e-05 &&
      (double)CONCAT44(uVar58,SUB84(dVar24,0)) != 1e-05) {
    mR = (matrix4 *)0x0;
  }
  else {
    dVar1 = (self->field_0).m[2];
    auVar5 = *(undefined1 (*) [16])((long)&self->field_0 + 0x48);
    dVar69 = auVar5._0_8_;
    dVar70 = auVar5._8_8_;
    auVar6 = *(undefined1 (*) [16])((long)&self->field_0 + 0x68);
    dVar65 = auVar6._0_8_;
    dVar66 = auVar6._8_8_;
    dVar50 = (self->field_0).m[5];
    dVar51 = (self->field_0).m[6];
    dVar52 = (self->field_0).m[3];
    dVar53 = (self->field_0).m[4];
    auVar7 = *(undefined1 (*) [16])((long)&self->field_0 + 0x38);
    dVar61 = dVar52 * dVar50;
    dVar63 = dVar52 * dVar51;
    uStack_360 = SUB84(dVar63,0);
    uStack_35c = (undefined4)((ulong)dVar63 >> 0x20);
    dVar9 = auVar7._0_8_;
    dVar25 = dVar50 * dVar1;
    auVar11._8_4_ = SUB84(dVar9 * dVar1,0);
    auVar11._0_8_ = dVar25;
    auVar11._12_4_ = (int)((ulong)(dVar9 * dVar1) >> 0x20);
    dVar10 = auVar7._8_8_;
    auVar12._8_4_ = SUB84(dVar70 * dVar52,0);
    auVar12._0_8_ = dVar10 * dVar9;
    auVar12._12_4_ = (int)((ulong)(dVar70 * dVar52) >> 0x20);
    auVar8 = *(undefined1 (*) [16])((long)&self->field_0 + 0x58);
    dVar67 = auVar8._0_8_;
    dVar68 = auVar8._8_8_;
    auVar13._8_4_ = auVar8._0_4_;
    auVar13._0_8_ = dVar69;
    auVar13._12_4_ = auVar8._4_4_;
    auVar14._8_4_ = SUB84(dVar67 * dVar1,0);
    auVar14._0_8_ = dVar69 * dVar51;
    auVar14._12_4_ = (int)((ulong)(dVar67 * dVar1) >> 0x20);
    auVar15._8_4_ = auVar7._8_4_;
    auVar15._0_8_ = dVar67;
    auVar15._12_4_ = auVar7._12_4_;
    auVar16._8_4_ = SUB84(dVar10 * dVar1,0);
    auVar16._0_8_ = dVar67 * dVar51;
    auVar16._12_4_ = (int)((ulong)(dVar10 * dVar1) >> 0x20);
    auVar17._8_4_ = SUB84(dVar10 * dVar1,0);
    auVar17._0_8_ = dVar69 * dVar51;
    auVar17._12_4_ = (int)((ulong)(dVar10 * dVar1) >> 0x20);
    auVar28._8_4_ = SUB84(dVar69 * dVar1,0);
    auVar28._0_8_ = dVar10 * dVar51;
    auVar28._12_4_ = (int)((ulong)(dVar69 * dVar1) >> 0x20);
    dVar38 = -dVar1;
    auVar29._8_4_ = SUB84(dVar1,0);
    auVar29._0_8_ = -dVar51;
    auVar29._12_4_ = (int)((ulong)dVar38 >> 0x20);
    dVar49 = dVar38 * dVar9;
    dVar38 = dVar38 * dVar50;
    auVar48._8_4_ = SUB84(dVar38,0);
    auVar48._0_8_ = dVar49;
    auVar48._12_4_ = (int)((ulong)dVar38 >> 0x20);
    dVar2 = (self->field_0).m[0xf];
    dVar3 = (self->field_0).m[1];
    uVar60 = (undefined4)((ulong)dVar3 >> 0x20);
    uVar58 = auVar5._8_4_;
    uVar59 = auVar5._12_4_;
    dVar54 = (self->field_0).m[0xe];
    dVar55 = (self->field_0).m[0xf];
    auVar18._8_4_ = auVar6._0_4_;
    auVar18._0_8_ = dVar66;
    auVar18._12_4_ = auVar6._4_4_;
    auVar39._8_4_ = SUB84(dVar3,0);
    auVar39._0_8_ = dVar50;
    auVar39._12_4_ = uVar60;
    dStack_350 = auVar14._8_8_;
    dVar45 = (((dVar70 * dVar52 * dVar65 + dVar3 * dVar67 * dVar54 + dVar1 * dVar69 * dVar2) -
              dVar70 * dVar3 * dVar55) - dStack_350 * dVar65) - dVar69 * dVar52 * dVar66;
    dVar4 = (self->field_0).m[0];
    unique0x10001dad = SUB84(dVar45,0);
    local_98 = (((dVar69 * dVar9 * dVar66 + dVar50 * dVar70 * dVar55 + dVar67 * dVar51 * dVar65) -
                dVar67 * dVar50 * dVar54) - dVar69 * dVar51 * dVar2) - dVar70 * dVar9 * dVar65;
    unique0x10001db1 = (int)((ulong)dVar45 >> 0x20);
    dVar62 = dVar52 * dVar53;
    auVar6._8_4_ = SUB84(dVar3,0);
    auVar6._0_8_ = dVar10;
    auVar6._12_4_ = uVar60;
    dVar64 = dVar3 * dVar51;
    dStack_290 = auVar11._8_8_;
    dVar45 = -dVar3;
    dVar43 = dVar45 * dVar51;
    dVar46 = dVar45 * dVar9;
    auVar41._8_4_ = SUB84(dVar46,0);
    auVar41._0_8_ = dVar43;
    auVar41._12_4_ = (int)((ulong)dVar46 >> 0x20);
    uVar60 = auVar5._0_4_;
    uVar71 = auVar5._4_4_;
    dVar40 = -dVar52;
    dVar44 = dVar40 * dVar50;
    dVar47 = dVar40 * dVar51;
    auVar42._8_4_ = SUB84(dVar47,0);
    auVar42._0_8_ = dVar44;
    auVar42._12_4_ = (int)((ulong)dVar47 >> 0x20);
    adStack_90[1] =
         dVar65 * dVar47 +
         dVar2 * dVar38 + dVar66 * dVar46 + dVar2 * dVar64 + dVar65 * dStack_290 + dVar61 * dVar66;
    adStack_90[2] =
         dVar70 * dVar44 +
         dVar69 * dVar49 +
         dVar67 * dVar43 + dVar70 * dVar3 * dVar9 + dVar67 * dVar25 + dVar63 * dVar69;
    dStack_2a0 = auVar29._8_8_;
    auVar30._8_4_ = SUB84(dVar45 * dVar53,0);
    auVar30._0_8_ = -dVar50 * dVar52;
    auVar30._12_4_ = (int)((ulong)(dVar45 * dVar53) >> 0x20);
    auVar31._8_4_ = auVar8._8_4_;
    auVar31._0_8_ = dVar2;
    auVar31._12_4_ = auVar8._12_4_;
    auVar32._8_4_ = SUB84(dVar2,0);
    auVar32._0_8_ = dVar68;
    auVar32._12_4_ = (int)((ulong)dVar2 >> 0x20);
    dStack_310 = auVar16._8_8_;
    auVar33._8_4_ = auVar8._8_4_;
    auVar33._0_8_ = dVar66;
    auVar33._12_4_ = auVar8._12_4_;
    dStack_300 = auVar12._8_8_;
    adStack_90[3] =
         (((dVar70 * dVar9 * dVar68 + dVar67 * dVar53 * dVar54 + dVar51 * dVar10 * dVar2) -
          dVar70 * dVar53 * dVar2) - dVar67 * dVar51 * dVar68) - dVar10 * dVar9 * dVar66;
    adStack_90[4] =
         (((dVar52 * dVar10 * dVar66 + dVar70 * dVar4 * dVar55 + dVar67 * dVar1 * dVar68) -
          dVar67 * dVar4 * dVar66) - dStack_310 * dVar2) - dStack_300 * dVar68;
    dVar46 = dVar4 * dVar9;
    auVar26._8_4_ = SUB84(dVar4 * dVar51,0);
    auVar26._0_8_ = dVar46;
    auVar26._12_4_ = (int)((ulong)(dVar4 * dVar51) >> 0x20);
    auVar56._8_4_ = uStack_360;
    auVar56._0_8_ = dVar61;
    auVar56._12_4_ = uStack_35c;
    auVar27._8_4_ = SUB84(dVar61,0);
    auVar27._0_8_ = dVar62;
    auVar27._12_4_ = (int)((ulong)dVar61 >> 0x20);
    auVar5._8_4_ = uVar58;
    auVar5._0_8_ = auVar56._8_8_;
    auVar5._12_4_ = uVar59;
    auVar8._8_4_ = uVar60;
    auVar8._0_8_ = dVar9;
    auVar8._12_4_ = uVar71;
    auVar19._8_4_ = uVar60;
    auVar19._0_8_ = dVar2;
    auVar19._12_4_ = uVar71;
    auVar20._8_4_ = uVar60;
    auVar20._0_8_ = dVar68;
    auVar20._12_4_ = uVar71;
    dVar38 = -dVar4;
    dVar45 = dVar51 * dVar38;
    auVar21._8_4_ = SUB84(dVar9 * dVar38,0);
    auVar21._0_8_ = dVar45;
    auVar21._12_4_ = (int)((ulong)(dVar9 * dVar38) >> 0x20);
    dStack_270 = auVar13._8_8_;
    auVar22._8_4_ = SUB84(dStack_270 * dVar4,0);
    auVar22._0_8_ = dVar69 * dVar53;
    auVar22._12_4_ = (int)((ulong)(dStack_270 * dVar4) >> 0x20);
    auVar34._8_4_ = SUB84(dVar69 * dVar4,0);
    auVar34._0_8_ = dVar67 * dVar53;
    auVar34._12_4_ = (int)((ulong)(dVar69 * dVar4) >> 0x20);
    auVar35._8_4_ = auVar7._8_4_;
    auVar35._0_8_ = dVar65;
    auVar35._12_4_ = auVar7._12_4_;
    uStack_2b0._0_4_ = SUB84(dVar64,0);
    uStack_2b0._4_4_ = (undefined4)((ulong)dVar64 >> 0x20);
    auVar36._8_4_ = (undefined4)uStack_2b0;
    auVar36._0_8_ = dVar66;
    auVar36._12_4_ = uStack_2b0._4_4_;
    auVar37._8_4_ = uVar58;
    auVar37._0_8_ = dVar65;
    auVar37._12_4_ = uVar59;
    auVar7._8_4_ = uVar60;
    auVar7._0_8_ = dVar66;
    auVar7._12_4_ = uVar71;
    auVar23._8_4_ = uVar58;
    auVar23._0_8_ = dVar68;
    auVar23._12_4_ = uVar59;
    dStack_310 = auVar26._8_8_;
    dStack_210 = auVar5._8_8_;
    dStack_340 = auVar21._8_8_;
    dStack_140 = auVar42._8_8_;
    adStack_90[5] =
         dVar66 * dVar40 * dVar53 +
         dVar49 * dVar68 +
         dVar2 * dVar45 + dVar68 * auVar56._8_8_ + dVar66 * dVar46 + dVar1 * dVar53 * dVar2;
    adStack_90[6] =
         dVar10 * dStack_140 +
         dStack_2a0 * dVar53 * dVar67 +
         dVar70 * dStack_340 + dVar62 * dStack_210 + dVar67 * dStack_310 + dVar10 * dStack_290;
    dStack_b0 = auVar15._8_8_;
    dStack_250 = auVar39._8_8_;
    dStack_190 = auVar32._8_8_;
    dStack_270 = auVar22._8_8_;
    dStack_1d0 = auVar8._8_8_;
    dStack_1e0 = auVar34._8_8_;
    dStack_160 = auVar31._8_8_;
    adStack_90[7] =
         (((dVar10 * dVar9 * dVar65 + dVar69 * dVar53 * dVar2 + dVar67 * dVar50 * dVar68) -
          dVar65 * dVar67 * dVar53) - dVar10 * dVar50 * dVar2) - dVar9 * dVar69 * dVar68;
    adStack_90[8] =
         (((dVar52 * dStack_1d0 * dVar68 + dStack_270 * dVar65 + dStack_b0 * dStack_250 * dStack_190
           ) - dVar2 * dStack_1e0) - dVar67 * dStack_250 * dStack_160) - dVar52 * dVar10 * dVar65;
    dStack_1a0 = auVar19._8_8_;
    dStack_350 = auVar27._8_8_;
    dStack_320 = auVar35._8_8_;
    dStack_130 = auVar30._8_8_;
    dStack_120 = auVar41._8_8_;
    dStack_170 = auVar20._8_8_;
    dVar46 = dVar40 * dVar53 * dStack_170 +
             dVar10 * dStack_120 +
             dVar67 * dVar38 * dVar50 +
             dStack_350 * dStack_320 + dStack_1a0 * dVar46 + dVar53 * dVar3 * dVar67;
    local_48._8_4_ = SUB84(dVar46,0);
    local_48._0_8_ =
         dVar44 * dVar68 +
         dVar2 * dStack_130 +
         dVar65 * dStack_340 + dVar62 * dVar65 + dVar2 * dVar4 * dVar50 + dVar3 * dVar9 * dVar68;
    local_48._12_4_ = (int)((ulong)dVar46 >> 0x20);
    dStack_100 = auVar6._8_8_;
    dStack_150 = auVar33._8_8_;
    dStack_d0 = auVar17._8_8_;
    dStack_f0 = auVar18._8_8_;
    dStack_e0 = auVar28._8_8_;
    dVar2 = (((dStack_d0 * dVar65 + dVar69 * dVar4 * dVar66 + dStack_100 * dVar70 * dStack_150) -
             dVar4 * dVar70 * dStack_f0) - dVar10 * dStack_250 * dVar66) - dStack_e0 * dVar68;
    local_38._8_4_ = SUB84(dVar2,0);
    local_38._0_8_ =
         (((dVar69 * dVar51 * dVar68 + dVar70 * dVar53 * dVar65 + dVar10 * dVar50 * dVar66) -
          dVar53 * dVar69 * dVar66) - dVar70 * dVar50 * dVar68) - dVar10 * dVar51 * dVar65;
    local_38._12_4_ = (int)((ulong)dVar2 >> 0x20);
    uStack_2b0 = auVar36._8_8_;
    dStack_1c0 = auVar37._8_8_;
    dStack_2d0 = auVar7._8_8_;
    dStack_200 = auVar23._8_8_;
    dStack_260 = auVar48._8_8_;
    dVar1 = dStack_260 * dStack_320 +
            dStack_200 * dStack_130 +
            dStack_2d0 * dVar45 +
            dVar1 * dVar53 * dStack_170 + dStack_1c0 * dVar4 * dVar50 + dVar10 * uStack_2b0;
    local_28._8_4_ = SUB84(dVar1,0);
    local_28._0_8_ =
         dStack_2a0 * dVar53 * dVar65 +
         dVar68 * dVar43 +
         dVar66 * dVar38 * dVar50 + dVar25 * dVar68 + dVar65 * dStack_310 + dVar53 * dVar3 * dVar66;
    local_28._12_4_ = (int)((ulong)dVar1 >> 0x20);
    lVar57 = 0;
    do {
      dVar1 = *(double *)(local_98 + lVar57 * 8 + 8);
      (mR->field_0).m[lVar57] = *(double *)(local_98 + lVar57 * 8) * (1.0 / dVar24);
      ((mR->field_0).m + lVar57)[1] = dVar1 * (1.0 / dVar24);
      lVar57 = lVar57 + 2;
    } while (lVar57 != 0x10);
  }
  return mR;
}

Assistant:

HYPAPI struct matrix4 *matrix4_inverse(const struct matrix4 *self, struct matrix4 *mR)
{
	struct matrix4 inverse;
	HYP_FLOAT determinant;
	uint8_t i;

	determinant = matrix4_determinant(self);

	/* calculated early for a quick exit if no determinant exists */
	if (scalar_equalsf(determinant, 0.0f)) {
		return NULL;
	}

	determinant = 1.0f / determinant;

	matrix4_identity(&inverse);

	B(11) = A3(22, 33, 44) + A3(23, 34, 42) + A3(24, 32, 43) - A3(22, 34, 43) - A3(23, 32, 44) - A3(24, 33, 42);
	B(12) = A3(12, 34, 43) + A3(13, 32, 44) + A3(14, 33, 42) - A3(12, 33, 44) - A3(13, 34, 42) - A3(14, 32, 43);
	B(13) = A3(12, 23, 44) + A3(13, 24, 42) + A3(14, 22, 43) - A3(12, 24, 43) - A3(13, 22, 44) - A3(14, 23, 42);
	B(14) = A3(12, 24, 33) + A3(13, 22, 34) + A3(14, 23, 32) - A3(12, 23, 34) - A3(13, 24, 32) - A3(14, 22, 33);
	B(21) = A3(21, 34, 43) + A3(23, 31, 44) + A3(24, 33, 41) - A3(21, 33, 44) - A3(23, 34, 41) - A3(24, 31, 43);
	B(22) = A3(11, 33, 44) + A3(13, 34, 41) + A3(14, 31, 43) - A3(11, 34, 43) - A3(13, 31, 44) - A3(14, 33, 41);
	B(23) = A3(11, 24, 43) + A3(13, 21, 44) + A3(14, 23, 41) - A3(11, 23, 44) - A3(13, 24, 41) - A3(14, 21, 43);
	B(24) = A3(11, 23, 34) + A3(13, 24, 31) + A3(14, 21, 33) - A3(11, 24, 33) - A3(13, 21, 34) - A3(14, 23, 31);
	B(31) = A3(21, 32, 44) + A3(22, 34, 41) + A3(24, 31, 42) - A3(21, 34, 42) - A3(22, 31, 44) - A3(24, 32, 41);
	B(32) = A3(11, 34, 42) + A3(12, 31, 44) + A3(14, 32, 41) - A3(11, 32, 44) - A3(12, 34, 41) - A3(14, 31, 42);
	B(33) = A3(11, 22, 44) + A3(12, 24, 41) + A3(14, 21, 42) - A3(11, 24, 42) - A3(12, 21, 44) - A3(14, 22, 41);
	B(34) = A3(11, 24, 32) + A3(12, 21, 34) + A3(14, 22, 31) - A3(11, 22, 34) - A3(12, 24, 31) - A3(14, 21, 32);
	B(41) = A3(21, 33, 42) + A3(22, 31, 43) + A3(23, 32, 41) - A3(21, 32, 43) - A3(22, 33, 41) - A3(23, 31, 42);
	B(42) = A3(11, 32, 43) + A3(12, 33, 41) + A3(13, 31, 42) - A3(11, 33, 42) - A3(12, 31, 43) - A3(13, 32, 41);
	B(43) = A3(11, 23, 42) + A3(12, 21, 43) + A3(13, 22, 41) - A3(11, 22, 43) - A3(12, 23, 41) - A3(13, 21, 42);
	B(44) = A3(11, 22, 33) + A3(12, 23, 31) + A3(13, 21, 32) - A3(11, 23, 32) - A3(12, 21, 33) - A3(13, 22, 31);

	/* divide the determinant */
	for (i = 0; i < 16; i++) {
		mR->m[i] = inverse.m[i] * determinant;
	}

	return mR;
}